

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *__s2;
  ImDrawChannel *pIVar1;
  ImDrawChannel *pIVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ImDrawCmd *pIVar11;
  long lVar12;
  int i_1;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  unsigned_short *__dest;
  int iVar17;
  int i;
  ImDrawCmd *pIVar18;
  
  if (this->_Count < 2) {
    return;
  }
  iVar17 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  iVar8 = this->_Count;
  if ((0 < iVar8) && (lVar10 = (long)(draw_list->CmdBuffer).Size, 0 < lVar10)) {
    pIVar11 = (draw_list->CmdBuffer).Data;
    pIVar18 = pIVar11 + lVar10 + -1;
    if (pIVar18 != (ImDrawCmd *)0x0) {
      iVar16 = pIVar11[lVar10 + -1].ElemCount + pIVar11[lVar10 + -1].IdxOffset;
      goto LAB_001330bf;
    }
  }
  pIVar18 = (ImDrawCmd *)0x0;
  iVar16 = 0;
LAB_001330bf:
  lVar10 = 1;
  iVar14 = 0;
  do {
    if (iVar8 <= lVar10) {
      ImVector<ImDrawCmd>::resize(&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + iVar14);
      ImVector<unsigned_short>::resize(&draw_list->IdxBuffer,(draw_list->IdxBuffer).Size + iVar17);
      pIVar11 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar14);
      __dest = (draw_list->IdxBuffer).Data + ((long)(draw_list->IdxBuffer).Size - (long)iVar17);
      lVar12 = 0x38;
      for (lVar10 = 1; lVar10 < this->_Count; lVar10 = lVar10 + 1) {
        pIVar2 = (this->_Channels).Data;
        lVar9 = (long)*(int *)((long)pIVar2 + lVar12 + -0x18);
        if (lVar9 != 0) {
          memcpy(pIVar11,*(void **)((long)pIVar2 + lVar12 + -0x10),lVar9 * 0x38);
          pIVar11 = pIVar11 + lVar9;
        }
        lVar9 = (long)*(int *)((long)pIVar2 + lVar12 + -8);
        if (lVar9 != 0) {
          memcpy(__dest,*(void **)((long)&(pIVar2->_CmdBuffer).Size + lVar12),lVar9 * 2);
          __dest = __dest + lVar9;
        }
        lVar12 = lVar12 + 0x20;
      }
      draw_list->_IdxWritePtr = __dest;
      lVar10 = (long)(draw_list->CmdBuffer).Size;
      if ((lVar10 == 0) ||
         (pIVar11 = (draw_list->CmdBuffer).Data,
         pIVar11[lVar10 + -1].UserCallback != (ImDrawCallback)0x0)) {
        ImDrawList::AddDrawCmd(draw_list);
        pIVar11 = (draw_list->CmdBuffer).Data;
        lVar10 = (long)(draw_list->CmdBuffer).Size;
      }
      pIVar18 = pIVar11 + lVar10 + -1;
      __s2 = &draw_list->_CmdHeader;
      if (pIVar11[lVar10 + -1].ElemCount == 0) {
        fVar4 = (__s2->ClipRect).x;
        fVar5 = (__s2->ClipRect).y;
        fVar6 = (draw_list->_CmdHeader).ClipRect.z;
        fVar7 = (draw_list->_CmdHeader).ClipRect.w;
        uVar3 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
        *(undefined8 *)&pIVar11[lVar10 + -1].ClipRect.w =
             *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
        *(undefined8 *)((long)&pIVar11[lVar10 + -1].TextureId + 4) = uVar3;
        (pIVar18->ClipRect).x = fVar4;
        (pIVar18->ClipRect).y = fVar5;
        pIVar11[lVar10 + -1].ClipRect.z = fVar6;
        pIVar11[lVar10 + -1].ClipRect.w = fVar7;
      }
      else {
        iVar8 = bcmp(pIVar18,__s2,0x1c);
        if (iVar8 != 0) {
          ImDrawList::AddDrawCmd(draw_list);
        }
      }
      this->_Count = 1;
      return;
    }
    pIVar1 = (this->_Channels).Data;
    pIVar2 = pIVar1 + lVar10;
    uVar13 = pIVar1[lVar10]._CmdBuffer.Size;
    uVar15 = (ulong)(int)uVar13;
    if (0 < (long)uVar15) {
      if ((pIVar2->_CmdBuffer).Data[uVar15 - 1].ElemCount == 0) {
        uVar15 = (ulong)(uVar13 - 1);
        (pIVar2->_CmdBuffer).Size = uVar13 - 1;
      }
      if (((int)uVar15 == 0) || (pIVar18 == (ImDrawCmd *)0x0)) {
LAB_0013315b:
        uVar13 = (uint)uVar15;
        if ((int)uVar13 < 1) goto LAB_0013317c;
      }
      else {
        pIVar11 = (pIVar2->_CmdBuffer).Data;
        iVar8 = bcmp(pIVar18,pIVar11,0x1c);
        if ((iVar8 == 0) &&
           (pIVar11->UserCallback == (ImDrawCallback)0x0 &&
            pIVar18->UserCallback == (ImDrawCallback)0x0)) {
          pIVar18->ElemCount = pIVar18->ElemCount + pIVar11->ElemCount;
          iVar16 = iVar16 + pIVar11->ElemCount;
          ImVector<ImDrawCmd>::erase(&pIVar2->_CmdBuffer,pIVar11);
          uVar15 = (ulong)(uint)(pIVar2->_CmdBuffer).Size;
          goto LAB_0013315b;
        }
      }
      uVar13 = (uint)uVar15;
      pIVar18 = (pIVar2->_CmdBuffer).Data + ((uVar15 & 0xffffffff) - 1);
    }
LAB_0013317c:
    iVar8 = (pIVar2->_IdxBuffer).Size;
    uVar15 = 0;
    if (0 < (int)uVar13) {
      uVar15 = (ulong)uVar13;
    }
    for (lVar12 = 0; uVar15 * 0x38 - lVar12 != 0; lVar12 = lVar12 + 0x38) {
      pIVar11 = (pIVar2->_CmdBuffer).Data;
      *(int *)((long)&pIVar11->IdxOffset + lVar12) = iVar16;
      iVar16 = iVar16 + *(int *)((long)&pIVar11->ElemCount + lVar12);
    }
    iVar14 = uVar13 + iVar14;
    iVar17 = iVar17 + iVar8;
    lVar10 = lVar10 + 1;
    iVar8 = this->_Count;
  } while( true );
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}